

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUMap.hh
# Opt level: O0

EvictedObject * __thiscall
phosg::
LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::evict_object(EvictedObject *__return_storage_ptr__,
              LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this)

{
  Item *i_00;
  out_of_range *this_00;
  Item *i;
  LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  EvictedObject *ret;
  
  i_00 = this->tail;
  if (i_00 != (Item *)0x0) {
    EvictedObject::EvictedObject(__return_storage_ptr__);
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&__return_storage_ptr__->key,i_00->key);
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&__return_storage_ptr__->value,&i_00->value);
    __return_storage_ptr__->size = i_00->size;
    unlink_item(this,i_00);
    ::std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>_>_>
    ::erase(&this->items,&__return_storage_ptr__->key);
    this->total_size = this->total_size - __return_storage_ptr__->size;
    return __return_storage_ptr__;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  ::std::out_of_range::out_of_range(this_00,"nothing to evict");
  __cxa_throw(this_00,&::std::out_of_range::typeinfo,::std::out_of_range::~out_of_range);
}

Assistant:

EvictedObject evict_object() {
    Item* i = this->tail;
    if (!i) {
      throw std::out_of_range("nothing to evict");
    }

    EvictedObject ret;
    ret.key = std::move(*i->key);
    ret.value = std::move(i->value);
    ret.size = i->size;

    this->unlink_item(i);
    this->items.erase(ret.key);
    this->total_size -= ret.size;
    return ret;
  }